

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

int run_test(int inprocess)

{
  long lVar1;
  int iVar2;
  uv_handle_type uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long *plVar9;
  test_ctx *ptVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  int64_t eval_b;
  int64_t eval_b_2;
  uv_thread_t tid;
  uv_process_t process;
  long lStack_158;
  test_ctx *ptStack_150;
  long alStack_140 [2];
  undefined1 auStack_130 [16];
  undefined8 *puStack_120;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined8 uStack_90;
  long local_88;
  long local_80;
  undefined1 local_78 [8];
  uv_process_t local_70;
  
  plVar9 = &local_88;
  if (inprocess == 0) {
    uStack_90 = (code *)0x1a8af2;
    spawn_helper(&ctx.channel,&local_70,"ipc_send_recv_helper");
    uStack_90 = (code *)0x1a8b00;
    connect_cb(&ctx.connect_req,0);
LAB_001a8b00:
    uStack_90 = (code *)0x1a8b05;
    uVar4 = uv_default_loop();
    uStack_90 = (code *)0x1a8b0f;
    iVar2 = uv_run(uVar4,0);
    local_88 = (long)iVar2;
    local_80 = 0;
    if (local_88 != 0) {
      uStack_90 = (code *)0x1a8b86;
      run_test_cold_3();
LAB_001a8b86:
      uStack_90 = (code *)0x1a8b93;
      run_test_cold_4();
LAB_001a8b93:
      uStack_90 = (code *)0x1a8ba0;
      run_test_cold_1();
      goto LAB_001a8ba0;
    }
    local_88 = 2;
    local_80 = (long)recv_cb_count;
    if (local_80 != 2) goto LAB_001a8b86;
    if (inprocess == 0) {
      return 2;
    }
    uStack_90 = (code *)0x1a8b56;
    iVar2 = uv_thread_join(local_78);
    local_88 = (long)iVar2;
    local_80 = 0;
    if (local_88 == 0) {
      return iVar2;
    }
  }
  else {
    uStack_90 = (code *)0x1a8a58;
    iVar2 = uv_thread_create(local_78,ipc_send_recv_helper_threadproc,0x2a);
    local_70.data = (void *)(long)iVar2;
    local_88 = 0;
    if (local_70.data != (void *)0x0) goto LAB_001a8b93;
    uStack_90 = (code *)0x1a8a80;
    uv_sleep(1000);
    uStack_90 = (code *)0x1a8a85;
    uVar4 = uv_default_loop();
    uStack_90 = (code *)0x1a8a99;
    iVar2 = uv_pipe_init(uVar4,&ctx,1);
    local_70.data = (void *)(long)iVar2;
    local_88 = 0;
    if (local_70.data == (void *)0x0) {
      uStack_90 = (code *)0x1a8ad8;
      uv_pipe_connect(0x36c228,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_001a8b00;
    }
LAB_001a8ba0:
    uStack_90 = (code *)0x1a8bad;
    run_test_cold_2();
  }
  iVar2 = (int)&local_80;
  uStack_90 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)plVar9 == &ctx.connect_req) {
    auStack_98 = (undefined1  [8])(long)iVar2;
    if (auStack_98 != (undefined1  [8])0x0) goto LAB_001a8cef;
    _auStack_98 = uv_buf_init(".",1);
    iVar2 = uv_write2(0x36c290,&ctx,auStack_98,1,0x36c428,0);
    uStack_a0 = 0;
    if (iVar2 != 0) goto LAB_001a8cfe;
    auVar12 = uv_buf_init(".",1);
    _auStack_98 = auVar12;
    iVar2 = uv_write2(0x36c358,&ctx,auStack_98,1,0x36c540,0);
    uStack_a0 = 0;
    if (iVar2 != 0) goto LAB_001a8d0d;
    iVar2 = uv_read_start(&ctx,alloc_cb,recv_cb);
    uStack_a0 = 0;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001a8cef:
    connect_cb_cold_2();
LAB_001a8cfe:
    connect_cb_cold_3();
LAB_001a8d0d:
    connect_cb_cold_4();
  }
  puVar6 = &uStack_a0;
  connect_cb_cold_5();
  extraout_RDX[1] = 8;
  ptVar10 = (test_ctx *)0x8;
  pvVar5 = malloc(8);
  *extraout_RDX = pvVar5;
  if (pvVar5 != (void *)0x0) {
    return (int)pvVar5;
  }
  alloc_cb_cold_1();
  puVar7 = puVar6;
  free((void *)*extraout_RDX_00);
  if (ptVar10 == &ctx) {
    while( true ) {
      lVar1 = (long)recv_cb_count + 1;
      uVar4 = 0x36c770;
      if ((long)recv_cb_count == 0) {
        uVar4 = 0x36c658;
      }
      recv_cb_count = (int)lVar1;
      if (puVar6 != (undefined8 *)0xfffffffffffff001) break;
      if (lVar1 != 2) {
        recv_cb_cold_7();
LAB_001a8f01:
        recv_cb_cold_5();
LAB_001a8f0e:
        recv_cb_cold_2();
LAB_001a8f1b:
        recv_cb_cold_6();
LAB_001a8f28:
        recv_cb_cold_4();
        goto LAB_001a8f35;
      }
LAB_001a8eb2:
      iVar2 = uv_pipe_pending_count(&ctx);
      if (iVar2 < 1) {
        if (recv_cb_count == 2) {
          iVar2 = uv_close(&ctx,0);
          return iVar2;
        }
        return iVar2;
      }
    }
    if ((long)puVar6 < 0) goto LAB_001a8f1b;
    iVar2 = uv_pipe_pending_count(&ctx);
    if (iVar2 < 1) goto LAB_001a8f0e;
    uVar3 = uv_pipe_pending_type(&ctx);
    if (uVar3 == ctx.expected_type) {
      if (uVar3 == UV_TCP) {
        iVar2 = uv_tcp_init(ctx.channel.loop,uVar4);
      }
      else {
        if (uVar3 != UV_NAMED_PIPE) goto LAB_001a8f42;
        iVar2 = uv_pipe_init(ctx.channel.loop,uVar4,0);
      }
      if (iVar2 == 0) {
        iVar2 = uv_accept(&ctx,uVar4);
        if (iVar2 != 0) goto LAB_001a8f01;
        goto LAB_001a8eb2;
      }
      goto LAB_001a8f28;
    }
LAB_001a8f35:
    recv_cb_cold_3();
LAB_001a8f42:
    abort();
  }
  recv_cb_cold_1();
  ptStack_150 = (test_ctx *)0x1a8f6b;
  puVar8 = puVar7;
  puStack_120 = puVar6;
  free((void *)*extraout_RDX_01);
  auStack_130._0_8_ = puVar7;
  iVar2 = (int)puVar8;
  if ((puVar7 == (undefined8 *)0xfffffffffffff001) || (puVar7 == (undefined8 *)0xffffffffffffff99))
  {
    return extraout_EAX;
  }
  alStack_140[0] = 0;
  if (-1 < (long)puVar7) {
    if (ptVar10 != (test_ctx *)0x36bc90) goto LAB_001a913e;
    ptStack_150 = (test_ctx *)0x1a8fbc;
    iVar2 = uv_pipe_pending_count(0x36bc90);
    if (iVar2 < 1) {
      return iVar2;
    }
    ptVar10 = (test_ctx *)0x36bc90;
    while( true ) {
      read_cb_count = read_cb_count + 1;
      uVar4 = 0x36be40;
      if (read_cb_count == 2) {
        uVar4 = 0x36bd78;
      }
      uVar11 = 0x36c028;
      if (read_cb_count == 2) {
        uVar11 = 0x36bf10;
      }
      ptStack_150 = (test_ctx *)0x1a901b;
      iVar2 = uv_pipe_pending_type(0x36bc90);
      if (iVar2 != 7) break;
      ptStack_150 = (test_ctx *)0x1a904b;
      iVar2 = uv_pipe_init(ctx2.channel.loop,uVar11,0);
LAB_001a904b:
      alStack_140[0] = (long)iVar2;
      alStack_140[1] = 0;
      if (alStack_140[0] != 0) {
LAB_001a911b:
        ptStack_150 = (test_ctx *)0x1a912a;
        read_cb_cold_2();
        goto LAB_001a912a;
      }
      ptStack_150 = (test_ctx *)0x1a9076;
      iVar2 = uv_accept(0x36bc90,uVar11);
      alStack_140[0] = (long)iVar2;
      alStack_140[1] = 0;
      if (alStack_140[0] != 0) {
LAB_001a910c:
        ptStack_150 = (test_ctx *)0x1a911b;
        read_cb_cold_3();
        goto LAB_001a911b;
      }
      ptStack_150 = (test_ctx *)0x1a909f;
      auVar12 = uv_buf_init(".",1);
      ptStack_150 = (test_ctx *)0x1a90c2;
      auStack_130 = auVar12;
      iVar2 = uv_write2(uVar4,0x36bc90,auStack_130,1,uVar11,write2_cb);
      alStack_140[0] = (long)iVar2;
      alStack_140[1] = 0;
      if (alStack_140[0] != 0) {
        ptStack_150 = (test_ctx *)0x1a910c;
        read_cb_cold_4();
        goto LAB_001a910c;
      }
      ptStack_150 = (test_ctx *)0x1a90e6;
      iVar2 = uv_pipe_pending_count(0x36bc90);
      if (iVar2 < 1) {
        return iVar2;
      }
    }
    if (iVar2 == 0xc) {
      ptStack_150 = (test_ctx *)0x1a9038;
      iVar2 = uv_tcp_init(ctx2.channel.loop,uVar11);
      goto LAB_001a904b;
    }
LAB_001a912a:
    ptStack_150 = (test_ctx *)0x1a912f;
    read_cb_cold_5();
  }
  iVar2 = (int)alStack_140;
  ptStack_150 = (test_ctx *)0x1a913e;
  read_cb_cold_6();
LAB_001a913e:
  ptStack_150 = (test_ctx *)write2_cb;
  read_cb_cold_1();
  lStack_158 = (long)iVar2;
  ptStack_150 = ptVar10;
  if (lStack_158 != 0) {
    plVar9 = &lStack_158;
    write2_cb_cold_1();
    iVar2 = uv_is_closing();
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = uv_close(plVar9,0);
    return iVar2;
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(0x36bf10,0);
    uv_close(0x36c028,0);
    uv_close(0x36bc90,0);
    iVar2 = uv_close(&ctx2,0);
    return iVar2;
  }
  return write2_cb_called;
}

Assistant:

static int run_test(int inprocess) {
  uv_process_t process;
  uv_thread_t tid;
  int r;

  if (inprocess) {
    r = uv_thread_create(&tid, ipc_send_recv_helper_threadproc, (void *) 42);
    ASSERT_OK(r);

    uv_sleep(1000);

    r = uv_pipe_init(uv_default_loop(), &ctx.channel, 1);
    ASSERT_OK(r);

    uv_pipe_connect(&ctx.connect_req, &ctx.channel, TEST_PIPENAME_3, connect_cb);
  } else {
    spawn_helper(&ctx.channel, &process, "ipc_send_recv_helper");

    connect_cb(&ctx.connect_req, 0);
  }

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(2, recv_cb_count);

  if (inprocess) {
    r = uv_thread_join(&tid);
    ASSERT_OK(r);
  }

  return 0;
}